

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true> __thiscall
duckdb::ZSTDStorage::InitCompression
          (ZSTDStorage *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
          *analyze_state_p)

{
  ZSTDCompressionState *this_00;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> local_20;
  
  local_20._M_head_impl =
       (analyze_state_p->
       super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)._M_t.
       super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
       super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl;
  (analyze_state_p->
  super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)._M_t.
  super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
  super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl = (AnalyzeState *)0x0;
  this_00 = (ZSTDCompressionState *)operator_new(0x150);
  ZSTDCompressionState::ZSTDCompressionState
            (this_00,checkpoint_data,
             (unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
              *)&local_20);
  *(ZSTDCompressionState **)this = this_00;
  if (local_20._M_head_impl != (AnalyzeState *)0x0) {
    (*(local_20._M_head_impl)->_vptr_AnalyzeState[1])();
  }
  return (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)
         (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)this;
}

Assistant:

unique_ptr<CompressionState> ZSTDStorage::InitCompression(ColumnDataCheckpointData &checkpoint_data,
                                                          unique_ptr<AnalyzeState> analyze_state_p) {
	return make_uniq<ZSTDCompressionState>(checkpoint_data,
	                                       unique_ptr_cast<AnalyzeState, ZSTDAnalyzeState>(std::move(analyze_state_p)));
}